

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArraySamplingTest::getPassThroughFragmentShaderCode
          (TextureCubeMapArraySamplingTest *this,samplerType sampler_type,
          string *out_fragment_shader_code)

{
  char cVar1;
  size_t sVar2;
  uint uVar3;
  bool *__s;
  char *__s_00;
  stringstream stream;
  long *local_1d0 [2];
  long local_1c0 [2];
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  uVar3 = sampler_type - Int;
  if (uVar3 < 4) {
    __s_00 = &DAT_01bc14bc + *(int *)(&DAT_01bc14bc + (ulong)uVar3 * 4);
    __s = (bool *)(&DAT_01bc14cc + *(int *)(&DAT_01bc14cc + (ulong)uVar3 * 4));
  }
  else {
    __s = fixed_sample_locations_values + 1;
    __s_00 = "vec4 ";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"${VERSION}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"precision highp float;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"/* Pass through fragment shader */",0x22);
  cVar1 = (char)(ostream *)local_1a0;
  std::ios::widen((char)*(_func_int **)(local_1a0._0_8_ + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,__s,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"in ",3);
  sVar2 = strlen(__s_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,__s_00,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"fs_in_color",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,";",1);
  std::ios::widen((char)*(_func_int **)(local_1a0._0_8_ + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::ios::widen((char)*(_func_int **)(local_1a0._0_8_ + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"layout(location = 0) ",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"out ",4);
  sVar2 = strlen(__s_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,__s_00,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"fs_out_color",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,";",1);
  std::ios::widen((char)*(_func_int **)(local_1a0._0_8_ + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::ios::widen((char)*(_func_int **)(local_1a0._0_8_ + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"void main()\n{\n    fs_out_color = fs_in_color;\n}\n",0x30);
  std::ios::widen((char)*(_func_int **)(local_1a0._0_8_ + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_fragment_shader_code,(string *)local_1d0);
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getPassThroughFragmentShaderCode(samplerType  sampler_type,
																	   std::string& out_fragment_shader_code)
{
	std::stringstream  stream;
	const glw::GLchar* color_type;
	const glw::GLchar* interpolation_type;
	const glw::GLchar* ignored_sampler_type;
	glw::GLuint		   ignored_n_components;
	bool			   ignored_is_shadow;

	/* Get type for color variables */
	getColorType(sampler_type, color_type, interpolation_type, ignored_sampler_type, ignored_n_components,
				 ignored_is_shadow);

	/* Preamble */
	stream << shader_code_preamble << shader_precision << "/* Pass through fragment shader */" << std::endl;

	/* in vec4 fs_in_color */
	stream << interpolation_type << shader_input << color_type << fragment_shader_input << ";" << std::endl;

	stream << std::endl;

	/* layout(location = 0) out vec4 fs_out_color */
	stream << shader_layout << shader_output << color_type << fragment_shader_output << ";" << std::endl;

	stream << std::endl;

	/* Body */
	stream << fragment_shader_pass_through_body_code << std::endl;

	/* Store result */
	out_fragment_shader_code = stream.str();
}